

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# cord.cc
# Opt level: O3

Nonnull<CordRepBtree_*> absl::lts_20240722::ForceBtree(CordRep *rep)

{
  CordRep *pCVar1;
  Nonnull<CordRepBtree_*> pCVar2;
  
  pCVar2 = (Nonnull<CordRepBtree_*>)rep;
  if (rep->tag != '\x03') {
    if (rep->tag == '\x02') {
      pCVar1 = (CordRep *)rep[1].length;
      if ((rep->refcount).count_.super___atomic_base<int>._M_i == 2) {
        if (rep->tag != '\x02') {
          __assert_fail("IsCrc()",
                        "/workspace/llm4binary/github/license_c_cmakelists/pybind[P]pybind11_protobuf/build_O3/_deps/absl-src/absl/strings/internal/cord_rep_crc.h"
                        ,0x5a,"CordRepCrc *absl::cord_internal::CordRep::crc()");
        }
        absl::lts_20240722::crc_internal::CrcCordState::~CrcCordState
                  ((CrcCordState *)&rep[1].refcount);
        operator_delete(rep,0x20);
        rep = pCVar1;
        if (pCVar1 == (CordRep *)0x0) {
          __assert_fail("edge != nullptr",
                        "/workspace/llm4binary/github/license_c_cmakelists/pybind[P]pybind11_protobuf/build_O3/_deps/absl-src/absl/strings/internal/cord_data_edge.h"
                        ,0x21,"bool absl::cord_internal::IsDataEdge(const CordRep *)");
        }
      }
      else {
        if (pCVar1 == (CordRep *)0x0) {
          __assert_fail("rep != nullptr",
                        "/workspace/llm4binary/github/license_c_cmakelists/pybind[P]pybind11_protobuf/build_O3/_deps/absl-src/absl/strings/internal/cord_internal.h"
                        ,0x370,"static CordRep *absl::cord_internal::CordRep::Ref(CordRep *)");
        }
        LOCK();
        (pCVar1->refcount).count_.super___atomic_base<int>._M_i =
             (pCVar1->refcount).count_.super___atomic_base<int>._M_i + 2;
        UNLOCK();
        cord_internal::CordRep::Unref(rep);
        rep = pCVar1;
      }
    }
    if ((rep->tag < 5) && ((rep->tag != 1 || (*(byte *)(*(long *)&rep[1].refcount + 0xc) < 5)))) {
      pCVar2 = (Nonnull<CordRepBtree_*>)
               absl::lts_20240722::cord_internal::CordRepBtree::CreateSlow(rep);
      return pCVar2;
    }
    pCVar2 = (Nonnull<CordRepBtree_*>)operator_new(0x40);
    (pCVar2->super_CordRep).refcount.count_.super___atomic_base<int>._M_i = 2;
    (pCVar2->super_CordRep).length = rep->length;
    (pCVar2->super_CordRep).tag = '\x03';
    (pCVar2->super_CordRep).storage[0] = '\0';
    (pCVar2->super_CordRep).storage[1] = '\0';
    (pCVar2->super_CordRep).storage[2] = '\x01';
    pCVar2->edges_[0] = rep;
  }
  return pCVar2;
}

Assistant:

static absl::Nonnull<CordRepBtree*> ForceBtree(CordRep* rep) {
  return rep->IsBtree()
             ? rep->btree()
             : CordRepBtree::Create(cord_internal::RemoveCrcNode(rep));
}